

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_Test::
~TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_Test
          (TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_Test *this)

{
  TEST_GROUP_CppUTestGroupMemoryReporterPlugin::~TEST_GROUP_CppUTestGroupMemoryReporterPlugin
            (&this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST(MemoryReporterPlugin, endOfaTestGroupWillReportSo)
{
    UtestForMemoryReportingPlugingTest fourthTest("differentGroupName", NULLPTR);
    UtestForMemoryReportingPlugingTest thirdTest("differentGroupName", &fourthTest);
    UtestForMemoryReportingPlugingTest secondTest("groupname", &thirdTest);
    UtestForMemoryReportingPlugingTest firstTest("groupname", &secondTest);

    mock("formatter").expectOneCall("report_testgroup_end").withParameter("result", result).withParameter("test", &secondTest);
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(firstTest, *result);
    reporter->postTestAction(firstTest, *result);
    reporter->preTestAction(secondTest, *result);
    reporter->postTestAction(secondTest, *result);
    reporter->preTestAction(thirdTest, *result);
    reporter->postTestAction(thirdTest, *result);
}